

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

void __thiscall IPAsirMiniSAT::~IPAsirMiniSAT(IPAsirMiniSAT *this)

{
  IPAsirMiniSAT *in_RDI;
  
  (in_RDI->super_SimpSolver).super_Solver._vptr_Solver = (_func_int **)&PTR__IPAsirMiniSAT_00179cc0;
  reset(in_RDI);
  Minisat::vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x161ce9);
  Minisat::vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x161cfa);
  Minisat::SimpSolver::~SimpSolver(&in_RDI->super_SimpSolver);
  return;
}

Assistant:

~IPAsirMiniSAT() { reset(); }